

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IntFloatCompare(i64 i,double r)

{
  int iVar1;
  undefined4 local_50;
  undefined4 local_4c;
  i64 y;
  longdouble x;
  double r_local;
  i64 i_local;
  
  iVar1 = sqlite3IsNaN(r);
  if (iVar1 == 0) {
    if (sqlite3Config.bUseLongDouble == '\0') {
      if (-9.223372036854776e+18 <= r) {
        if (r < 9.223372036854776e+18) {
          if (i < (long)r) {
            i_local._4_4_ = 0xffffffff;
          }
          else if ((long)r < i) {
            i_local._4_4_ = 1;
          }
          else {
            if (r <= (double)i) {
              local_50 = (uint)(r < (double)i);
            }
            else {
              local_50 = 0xffffffff;
            }
            i_local._4_4_ = local_50;
          }
        }
        else {
          i_local._4_4_ = 0xffffffff;
        }
      }
      else {
        i_local._4_4_ = 1;
      }
    }
    else {
      if (r <= (double)i) {
        local_4c = (uint)(r < (double)i);
      }
      else {
        local_4c = 0xffffffff;
      }
      i_local._4_4_ = local_4c;
    }
  }
  else {
    i_local._4_4_ = 1;
  }
  return i_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IntFloatCompare(i64 i, double r){
  if( sqlite3IsNaN(r) ){
    /* SQLite considers NaN to be a NULL. And all integer values are greater
    ** than NULL */
    return 1;
  }
  if( sqlite3Config.bUseLongDouble ){
    LONGDOUBLE_TYPE x = (LONGDOUBLE_TYPE)i;
    testcase( x<r );
    testcase( x>r );
    testcase( x==r );
    return (x<r) ? -1 : (x>r);
  }else{
    i64 y;
    if( r<-9223372036854775808.0 ) return +1;
    if( r>=9223372036854775808.0 ) return -1;
    y = (i64)r;
    if( i<y ) return -1;
    if( i>y ) return +1;
    testcase( doubleLt(((double)i),r) );
    testcase( doubleLt(r,((double)i)) );
    testcase( doubleEq(r,((double)i)) );
    return (((double)i)<r) ? -1 : (((double)i)>r);
  }
}